

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathfinderDVL.h
# Opt level: O0

int KeepAsUserDefaultsPathfinderDVL(PATHFINDERDVL *pPathfinderDVL)

{
  int iVar1;
  size_t sVar2;
  char *buf;
  PATHFINDERDVL *pPathfinderDVL_local;
  
  sVar2 = strlen("CK\r");
  iVar1 = WriteAllRS232Port(&pPathfinderDVL->RS232Port,(uint8 *)"CK\r",(int)sVar2);
  if (iVar1 == 0) {
    if ((pPathfinderDVL->bSaveRawData != 0) && (pPathfinderDVL->pfSaveFile != (FILE *)0x0)) {
      sVar2 = strlen("CK\r");
      fwrite("CK\r",sVar2,1,(FILE *)pPathfinderDVL->pfSaveFile);
      fflush((FILE *)pPathfinderDVL->pfSaveFile);
    }
    pPathfinderDVL_local._4_4_ = 0;
  }
  else {
    printf("Error writing data to a PathfinderDVL. \n");
    pPathfinderDVL_local._4_4_ = 1;
  }
  return pPathfinderDVL_local._4_4_;
}

Assistant:

inline int KeepAsUserDefaultsPathfinderDVL(PATHFINDERDVL* pPathfinderDVL)
{
	char* buf = "CK\r";

	if (WriteAllRS232Port(&pPathfinderDVL->RS232Port, (uint8*)buf, (int)strlen(buf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a PathfinderDVL. \n");
		return EXIT_FAILURE;
	}
	if ((pPathfinderDVL->bSaveRawData)&&(pPathfinderDVL->pfSaveFile))
	{
		fwrite(buf, strlen(buf), 1, pPathfinderDVL->pfSaveFile);
		fflush(pPathfinderDVL->pfSaveFile);
	}

	return EXIT_SUCCESS;
}